

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&> * __thiscall
Catch::ExprLhs<std::bitset<512ul>const&>::operator==
          (BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&>
           *__return_storage_ptr__,ExprLhs<std::bitset<512ul>const&> *this,bitset<512UL> *rhs)

{
  bitset<512UL> *pbVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  StringRef local_38;
  
  pbVar1 = *(bitset<512UL> **)this;
  if ((pbVar1->super__Base_bitset<8UL>)._M_w[0] == (rhs->super__Base_bitset<8UL>)._M_w[0]) {
    uVar4 = 0xffffffffffffffff;
    do {
      if (uVar4 == 6) {
        uVar5 = 7;
        break;
      }
      lVar2 = uVar4 + 2;
      uVar5 = uVar4 + 1;
      lVar3 = uVar4 + 2;
      uVar4 = uVar5;
    } while ((pbVar1->super__Base_bitset<8UL>)._M_w[lVar2] ==
             (rhs->super__Base_bitset<8UL>)._M_w[lVar3]);
    bVar6 = 6 < uVar5;
  }
  else {
    bVar6 = false;
  }
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar6;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00b5bc70;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }